

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O0

void migrate_version(string_view path)

{
  string_view_t fmt;
  __type_conflict2 _Var1;
  bool bVar2;
  ulong uVar3;
  string version;
  json db_json;
  path *in_stack_000000a8;
  undefined1 in_stack_000000b0 [16];
  string db_name;
  path db_root;
  string prev_version;
  string most_recent;
  path *in_stack_fffffffffffffdd8;
  undefined6 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde6;
  undefined1 in_stack_fffffffffffffde7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  path *in_stack_fffffffffffffe00;
  path *in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int iVar4;
  json *in_stack_fffffffffffffe28;
  undefined1 local_1a8 [160];
  string local_108 [48];
  json *in_stack_ffffffffffffff28;
  path *in_stack_ffffffffffffff30;
  json *in_stack_ffffffffffffff70;
  string local_68 [55];
  undefined1 local_31 [49];
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_stack_fffffffffffffe18
             ,in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  std::__cxx11::string::string(local_68);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_fffffffffffffe00,(basic_string_view<char,_std::char_traits<char>_> *)__rhs);
  std::experimental::filesystem::v1::__cxx11::path::parent_path();
  std::experimental::filesystem::v1::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffde7,
                              CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_fffffffffffffe00,(basic_string_view<char,_std::char_traits<char>_> *)__rhs);
  std::experimental::filesystem::v1::__cxx11::path::filename(in_stack_fffffffffffffe08);
  std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
            (in_stack_fffffffffffffdd8);
  std::experimental::filesystem::v1::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffde7,
                              CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  std::experimental::filesystem::v1::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffde7,
                              CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  do {
    std::__cxx11::string::operator_cast_to_basic_string_view(local_108);
    read_json(in_stack_000000a8,(string_view)in_stack_000000b0);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1a8 + 0x10);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)args,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)args_1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)CONCAT17(in_stack_fffffffffffffde7,
                              CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
    extract_version(in_stack_fffffffffffffe28);
    _Var1 = std::operator==(&in_stack_fffffffffffffe00->_M_pathname,__rhs);
    if (_Var1) {
      spdlog::error<char[47]>((char (*) [47])0x191123);
      iVar4 = 3;
    }
    else {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffde7,
                                       CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)
                                      ),&in_stack_fffffffffffffdd8->_M_pathname);
      if ((bVar2) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
        ::fmt::v6::basic_string_view<char>::basic_string_view
                  ((basic_string_view<char> *)
                   CONCAT17(in_stack_fffffffffffffde7,
                            CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)),
                   (char *)in_stack_fffffffffffffdd8);
        fmt.size_ = (size_t)in_stack_fffffffffffffe00;
        fmt.data_ = (char *)__rhs;
        spdlog::info<std::__cxx11::string,std::__cxx11::string>(fmt,args,args_1);
      }
      _Var1 = std::operator==(&in_stack_fffffffffffffe00->_M_pathname,__rhs);
      if (_Var1) {
        iVar4 = 3;
      }
      else {
        in_stack_fffffffffffffde7 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffde7,
                                      CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0))
                             ,(char *)in_stack_fffffffffffffdd8);
        if ((bool)in_stack_fffffffffffffde7) {
          upgrade_v1_0_0(in_stack_ffffffffffffff70);
        }
        in_stack_fffffffffffffde6 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffde7,
                                      CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0))
                             ,(char *)in_stack_fffffffffffffdd8);
        if ((bool)in_stack_fffffffffffffde6) {
          upgrade_v1_3_2(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        }
        std::__cxx11::string::operator=(local_68,(string *)&stack0xfffffffffffffe28);
        in_stack_fffffffffffffe00 =
             (path *)std::__cxx11::string::operator_cast_to_basic_string_view(local_108);
        save_json((path *)prev_version._0_8_,(string_view)prev_version._8_16_,(json *)db_root._56_8_
                 );
        iVar4 = 0;
      }
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)CONCAT17(in_stack_fffffffffffffde7,
                              CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  } while (iVar4 == 0);
  std::__cxx11::string::~string(local_108);
  std::experimental::filesystem::v1::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffde7,
                              CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  return;
}

Assistant:

void migrate_version(std::string_view path) {
    std::string most_recent = "1.5.0";
    std::string prev_version;
    auto db_root = fs::path(path).parent_path();
    auto db_name = std::string(fs::path(path).filename());
    while (true) {
        json db_json = std::move(read_json(db_root, db_name));
        std::string version = extract_version(db_json);
        if (version == prev_version) {
            spdlog::error("Upgrade procedure failed. Trying to proceed...");
            break;
        }
        if (version != prev_version && !prev_version.empty()) {
            spdlog::info("UPGRADE: {} -> {}.", prev_version, version);
        }
        if (version == most_recent) {
            break;
        }
        if (version == "1.0.0") {
            upgrade_v1_0_0(&db_json);
        }
        if (version == "1.3.2") {
            upgrade_v1_3_2(db_root, &db_json);
        }
        prev_version = version;
        save_json(db_root, db_name, db_json);
    }
}